

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_58::Register(ExtensionInfo *info)

{
  int iVar1;
  flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *this;
  LogMessage *pLVar2;
  GetTypeNameReturnType local_70;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>::iterator,_bool>
  local_38;
  ExtensionInfo *local_10;
  ExtensionInfo *info_local;
  
  local_10 = info;
  if ((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
      local_static_registry == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 Register(google::protobuf::internal::ExtensionInfo_const&)::
                                 local_static_registry);
    if (iVar1 != 0) {
      this = (flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              *)operator_new(0x20);
      absl::lts_20240722::
      flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
      ::flat_hash_set(this);
      Register::local_static_registry =
           OnShutdownDelete<absl::lts_20240722::flat_hash_set<google::protobuf::internal::ExtensionInfo,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>>
                     (this);
      __cxa_guard_release(&(anonymous_namespace)::
                           Register(google::protobuf::internal::ExtensionInfo_const&)::
                           local_static_registry);
    }
  }
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::insert<google::protobuf::internal::ExtensionInfo,_0,_0>
            (&local_38,
             &Register::local_static_registry->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,local_10);
  if (((local_38.second ^ 0xffU) & 1) == 0) {
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,0x5e);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [44])"Multiple extension registrations for type \"");
  MessageLite::GetTypeName_abi_cxx11_(&local_70,local_10->message);
  pLVar2 = (LogMessage *)
           absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(string *)&local_70);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [17])"\", field number ");
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,local_10->number);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x64b52c);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar2);
  std::__cxx11::string::~string((string *)&local_70);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!local_static_registry->insert(info).second) {
    ABSL_LOG(FATAL) << "Multiple extension registrations for type \""
                    << info.message->GetTypeName() << "\", field number "
                    << info.number << ".";
  }
}